

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O1

VRDatumPtr __thiscall MinVR::CreateVRDatumStringArray(MinVR *this,void *pData)

{
  VRDatumStringArray *this_00;
  undefined4 *puVar1;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  this_00 = (VRDatumStringArray *)operator_new(0x68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_30,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pData);
  VRDatumStringArray::VRDatumStringArray(this_00,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  *(VRDatumStringArray **)this = this_00;
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 1;
  *(undefined4 **)(this + 8) = puVar1;
  VVar2.reference = extraout_RDX;
  VVar2.pData = (VRDatum_conflict *)this;
  return VVar2;
}

Assistant:

VRDatumPtr CreateVRDatumStringArray(void *pData) {
  VRDatumStringArray *obj =
    new VRDatumStringArray(*static_cast<VRStringArray *>(pData));
  return VRDatumPtr(obj);
}